

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtils.cpp
# Opt level: O3

string * ApprovalTests::FileUtils::getDirectory(string *__return_storage_ptr__,string *filePath)

{
  undefined1 *local_40;
  undefined1 local_30 [16];
  
  SystemUtils::getDirectorySeparator_abi_cxx11_();
  ::std::__cxx11::string::rfind((char *)filePath,(ulong)local_40,0xffffffffffffffff);
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  ::std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)filePath);
  return __return_storage_ptr__;
}

Assistant:

std::string FileUtils::getDirectory(const std::string& filePath)
    {
        auto end = filePath.rfind(SystemUtils::getDirectorySeparator()) + 1;
        auto directory = filePath.substr(0, end);
        return directory;
    }